

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

ImVec2 InputTextCalcTextSizeW
                 (ImWchar *text_begin,ImWchar *text_end,ImWchar **remaining,ImVec2 *out_offset,
                 bool stop_on_new_line)

{
  float fVar1;
  ushort uVar2;
  ImFont *pIVar3;
  ImVec2 IVar4;
  ImVec2 IVar5;
  char cVar6;
  float *pfVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  
  pIVar3 = GImGui->Font;
  fVar1 = GImGui->FontSize;
  fVar10 = 0.0;
  fVar8 = 0.0;
  fVar9 = 0.0;
  do {
    if (text_end <= text_begin) break;
    uVar2 = *text_begin;
    if (uVar2 == 0xd) {
LAB_00140dee:
      cVar6 = '\0';
    }
    else {
      if (uVar2 != 10) {
        pfVar7 = (float *)((ulong)((uint)uVar2 * 4) + (long)(pIVar3->IndexAdvanceX).Data);
        if ((pIVar3->IndexAdvanceX).Size <= (int)(uint)uVar2) {
          pfVar7 = &pIVar3->FallbackAdvanceX;
        }
        fVar10 = fVar10 + *pfVar7 * (fVar1 / pIVar3->FontSize);
        goto LAB_00140dee;
      }
      fVar8 = (float)(~-(uint)(fVar10 <= fVar8) & (uint)fVar10 |
                     -(uint)(fVar10 <= fVar8) & (uint)fVar8);
      fVar9 = fVar9 + fVar1;
      fVar10 = 0.0;
      cVar6 = (char)out_offset;
    }
    text_begin = text_begin + 1;
  } while (cVar6 == '\0');
  if (remaining != (ImWchar **)0x0) {
    *remaining = text_begin;
  }
  if (fVar8 < fVar10) {
    fVar8 = fVar10;
  }
  if (fVar9 != 0.0 && fVar10 <= 0.0) {
    IVar4.y = fVar9;
    IVar4.x = fVar8;
    return IVar4;
  }
  IVar5.y = fVar1 + fVar9;
  IVar5.x = fVar8;
  return IVar5;
}

Assistant:

static ImVec2 InputTextCalcTextSizeW(const ImWchar* text_begin, const ImWchar* text_end, const ImWchar** remaining, ImVec2* out_offset, bool stop_on_new_line)
{
    ImGuiContext& g = *GImGui;
    ImFont* font = g.Font;
    const float line_height = g.FontSize;
    const float scale = line_height / font->FontSize;

    ImVec2 text_size = ImVec2(0,0);
    float line_width = 0.0f;

    const ImWchar* s = text_begin;
    while (s < text_end)
    {
        unsigned int c = (unsigned int)(*s++);
        if (c == '\n')
        {
            text_size.x = ImMax(text_size.x, line_width);
            text_size.y += line_height;
            line_width = 0.0f;
            if (stop_on_new_line)
                break;
            continue;
        }
        if (c == '\r')
            continue;

        const float char_width = font->GetCharAdvance((ImWchar)c) * scale;
        line_width += char_width;
    }

    if (text_size.x < line_width)
        text_size.x = line_width;

    if (out_offset)
        *out_offset = ImVec2(line_width, text_size.y + line_height);  // offset allow for the possibility of sitting after a trailing \n

    if (line_width > 0 || text_size.y == 0.0f)                        // whereas size.y will ignore the trailing \n
        text_size.y += line_height;

    if (remaining)
        *remaining = s;

    return text_size;
}